

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

void __thiscall S2Loop::InitBound(S2Loop *this)

{
  VType VVar1;
  bool bVar2;
  int iVar3;
  S2Point *b_00;
  int i;
  int i_00;
  S1Interval SVar4;
  S2LatLngRect b;
  S2LatLngRect local_f0;
  S2LatLngRect local_c8;
  S1Interval local_98;
  R1Interval local_88;
  S2LatLngRectBounder local_78;
  
  iVar3 = this->num_vertices_;
  if (iVar3 == 1) {
    if ((this->origin_inside_ & 1U) == 0) {
      (this->bound_).lat_.bounds_.c_[0] = 1.0;
      (this->bound_).lat_.bounds_.c_[1] = 0.0;
      (this->bound_).lng_.bounds_.c_[0] = 3.141592653589793;
      (this->bound_).lng_.bounds_.c_[1] = -3.141592653589793;
      VVar1 = (this->bound_).lat_.bounds_.c_[1];
      (this->subregion_bound_).lat_.bounds_.c_[0] = (this->bound_).lat_.bounds_.c_[0];
      (this->subregion_bound_).lat_.bounds_.c_[1] = VVar1;
      VVar1 = (this->bound_).lng_.bounds_.c_[1];
      (this->subregion_bound_).lng_.bounds_.c_[0] = (this->bound_).lng_.bounds_.c_[0];
      (this->subregion_bound_).lng_.bounds_.c_[1] = VVar1;
    }
    else {
      S2LatLngRect::Full();
      (this->bound_).lng_.bounds_.c_[0] = local_78.a_latlng_.coords_.c_[0];
      (this->bound_).lng_.bounds_.c_[1] = local_78.a_latlng_.coords_.c_[1];
      (this->bound_).lat_.bounds_.c_[0] = local_78.a_.c_[1];
      (this->bound_).lat_.bounds_.c_[1] = local_78.a_.c_[2];
      (this->subregion_bound_).lat_.bounds_.c_[0] = local_78.a_.c_[1];
      (this->subregion_bound_).lat_.bounds_.c_[1] = local_78.a_.c_[2];
      (this->subregion_bound_).lng_.bounds_.c_[0] = local_78.a_latlng_.coords_.c_[0];
      (this->subregion_bound_).lng_.bounds_.c_[1] = local_78.a_latlng_.coords_.c_[1];
    }
  }
  else {
    local_78.a_.c_[2] = 0.0;
    local_78.a_latlng_.coords_.c_[0] = 0.0;
    local_78.a_.c_[0] = 0.0;
    local_78.a_.c_[1] = 0.0;
    local_78.a_latlng_.coords_.c_[1] = 0.0;
    local_78.bound_.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_00305080;
    local_78.bound_.lat_.bounds_.c_[0] = 1.0;
    local_78.bound_.lat_.bounds_.c_[1] = 0.0;
    local_78.bound_.lng_.bounds_.c_[0] = 3.141592653589793;
    local_78.bound_.lng_.bounds_.c_[1] = -3.141592653589793;
    for (i_00 = 0; i_00 <= iVar3; i_00 = i_00 + 1) {
      b_00 = vertex(this,i_00);
      S2LatLngRectBounder::AddPoint(&local_78,b_00);
      iVar3 = this->num_vertices_;
    }
    S2LatLngRectBounder::GetBound(&local_f0,&local_78);
    local_c8.super_S2Region._vptr_S2Region = (_func_int **)0x0;
    local_c8.lat_.bounds_.c_[0] = 0.0;
    local_c8.lat_.bounds_.c_[1] = 1.0;
    bVar2 = Contains(this,(S2Point *)&local_c8);
    if (bVar2) {
      local_88.bounds_.c_[0] = local_f0.lat_.bounds_.c_[0];
      local_88.bounds_.c_[1] = 1.5707963267948966;
      SVar4 = S1Interval::Full();
      local_98.bounds_.c_[0] = SVar4.bounds_.c_[0];
      local_98.bounds_.c_[1] = SVar4.bounds_.c_[1];
      S2LatLngRect::S2LatLngRect(&local_c8,&local_88,&local_98);
      local_f0.lng_.bounds_.c_[0] = local_c8.lng_.bounds_.c_[0];
      local_f0.lng_.bounds_.c_[1] = local_c8.lng_.bounds_.c_[1];
      local_f0.lat_.bounds_.c_[0] = local_c8.lat_.bounds_.c_[0];
      local_f0.lat_.bounds_.c_[1] = local_c8.lat_.bounds_.c_[1];
    }
    if ((((local_f0.lng_.bounds_.c_[0] == -3.141592653589793) && (!NAN(local_f0.lng_.bounds_.c_[0]))
         ) && (local_f0.lng_.bounds_.c_[1] == 3.141592653589793)) &&
       (!NAN(local_f0.lng_.bounds_.c_[1]))) {
      local_c8.super_S2Region._vptr_S2Region = (_func_int **)0x0;
      local_c8.lat_.bounds_.c_[0] = 0.0;
      local_c8.lat_.bounds_.c_[1] = -1.0;
      bVar2 = Contains(this,(S2Point *)&local_c8);
      if (bVar2) {
        local_f0.lat_.bounds_.c_[0] = -1.5707963267948966;
      }
    }
    (this->bound_).lng_.bounds_.c_[0] = local_f0.lng_.bounds_.c_[0];
    (this->bound_).lng_.bounds_.c_[1] = local_f0.lng_.bounds_.c_[1];
    (this->bound_).lat_.bounds_.c_[0] = local_f0.lat_.bounds_.c_[0];
    (this->bound_).lat_.bounds_.c_[1] = local_f0.lat_.bounds_.c_[1];
    S2LatLngRectBounder::ExpandForSubregions(&local_c8,&this->bound_);
    (this->subregion_bound_).lng_.bounds_.c_[0] = local_c8.lng_.bounds_.c_[0];
    (this->subregion_bound_).lng_.bounds_.c_[1] = local_c8.lng_.bounds_.c_[1];
    (this->subregion_bound_).lat_.bounds_.c_[0] = local_c8.lat_.bounds_.c_[0];
    (this->subregion_bound_).lat_.bounds_.c_[1] = local_c8.lat_.bounds_.c_[1];
  }
  return;
}

Assistant:

void S2Loop::InitBound() {
  // Check for the special empty and full loops.
  if (is_empty_or_full()) {
    if (is_empty()) {
      subregion_bound_ = bound_ = S2LatLngRect::Empty();
    } else {
      subregion_bound_ = bound_ = S2LatLngRect::Full();
    }
    return;
  }

  // The bounding rectangle of a loop is not necessarily the same as the
  // bounding rectangle of its vertices.  First, the maximal latitude may be
  // attained along the interior of an edge.  Second, the loop may wrap
  // entirely around the sphere (e.g. a loop that defines two revolutions of a
  // candy-cane stripe).  Third, the loop may include one or both poles.
  // Note that a small clockwise loop near the equator contains both poles.

  S2LatLngRectBounder bounder;
  for (int i = 0; i <= num_vertices(); ++i) {
    bounder.AddPoint(vertex(i));
  }
  S2LatLngRect b = bounder.GetBound();
  if (Contains(S2Point(0, 0, 1))) {
    b = S2LatLngRect(R1Interval(b.lat().lo(), M_PI_2), S1Interval::Full());
  }
  // If a loop contains the south pole, then either it wraps entirely
  // around the sphere (full longitude range), or it also contains the
  // north pole in which case b.lng().is_full() due to the test above.
  // Either way, we only need to do the south pole containment test if
  // b.lng().is_full().
  if (b.lng().is_full() && Contains(S2Point(0, 0, -1))) {
    b.mutable_lat()->set_lo(-M_PI_2);
  }
  bound_ = b;
  subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
}